

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setCalendar(QDateTimeEdit *this,undefined8 param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  QDateTime previousValue;
  QDateTime local_40 [8];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  QDateTime::QDateTime(local_40);
  setDateTime(this,local_40);
  QDateTime::~QDateTime(local_40);
  QDateTimeParser::setCalendar(lVar1 + 0x3d8,param_2);
  setDateTime(this,(QDateTime *)&local_38);
  QDateTime::~QDateTime((QDateTime *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setCalendar(QCalendar calendar)
{
    Q_D(QDateTimeEdit);
    // Set invalid date time to prevent runtime crashes on calendar change
    QDateTime previousValue = d->value.toDateTime();
    setDateTime(QDateTime());
    d->setCalendar(calendar);
    setDateTime(previousValue);
}